

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O2

long __thiscall
gl4cts::anon_unknown_0::SeparateProgramsFragment::Run(SeparateProgramsFragment *this)

{
  uint uVar1;
  long lVar2;
  uint program;
  mapped_type *pmVar3;
  allocator<char> local_331;
  long error;
  GLenum props5 [13];
  GLint expected5 [13];
  GLenum props7 [11];
  GLint expected3 [11];
  key_type local_248;
  undefined8 local_228;
  undefined4 local_220;
  mapped_type local_21c;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined4 local_200;
  GLenum props3 [11];
  GLint expected2 [10];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesBV;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesSSB;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  mapped_type local_120;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesU;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesO;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesI;
  char *srcTCS;
  GLenum props6 [7];
  GLenum props2 [10];
  
  error = 0;
  program = (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.
              super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x18])(this,0x8b30,1);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,(ulong)program,0x92e3,0x92f6,9,&error);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,(ulong)program,0x92e3,0x92f5,1,&error);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,(ulong)program,0x92e4,0x92f6,9,&error);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,(ulong)program,0x92e4,0x92f5,1,&error);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,(ulong)program,0x92e1,0x92f6,2,&error);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,(ulong)program,0x92e1,0x92f5,1,&error);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,(ulong)program,0x92e5,0x92f6,2,&error);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,(ulong)program,0x92e5,0x92f5,1,&error);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,(ulong)program,0x92e6,0x92f5,1,&error);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,(ulong)program,0x92e6,0x92f6,0xd,&error);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,(ulong)program,0x92e6,0x92f7,1,&error);
  indicesSSB._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indicesSSB._M_t._M_impl.super__Rb_tree_header._M_header;
  indicesSSB._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indicesSSB._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indicesSSB._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  indicesBV._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indicesBV._M_t._M_impl.super__Rb_tree_header._M_header;
  indicesBV._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indicesBV._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indicesBV._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  indicesI._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indicesI._M_t._M_impl.super__Rb_tree_header._M_header;
  indicesI._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indicesI._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indicesI._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  indicesO._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indicesO._M_t._M_impl.super__Rb_tree_header._M_header;
  indicesO._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indicesO._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indicesU._M_t._M_impl.super__Rb_tree_header._M_header;
  indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  indicesBV._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indicesBV._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  indicesSSB._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indicesSSB._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indicesU._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  indicesO._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indicesO._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  indicesI._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indicesI._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props5,"vs_color",(allocator<char> *)expected5);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])(this,(ulong)program,0x92e3,&indicesI,props5,&error);
  std::__cxx11::string::~string((string *)props5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props5,"fs_color",(allocator<char> *)expected5);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])(this,(ulong)program,0x92e4,&indicesO,props5,&error);
  std::__cxx11::string::~string((string *)props5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props5,"x",(allocator<char> *)expected5);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])(this,(ulong)program,0x92e1,&indicesU,props5,&error);
  std::__cxx11::string::~string((string *)props5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props5,"SimpleBuffer",(allocator<char> *)expected5);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])(this,(ulong)program,0x92e6,&indicesSSB,props5,&error);
  std::__cxx11::string::~string((string *)props5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props5,"a",(allocator<char> *)expected5);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])(this,(ulong)program,0x92e5,&indicesBV,props5,&error);
  std::__cxx11::string::~string((string *)props5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props5,"SimpleBuffer",(allocator<char> *)props3);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesSSB,(key_type *)props5);
  uVar1 = *pmVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)expected5,"SimpleBuffer",(allocator<char> *)expected3);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])(this,(ulong)program,0x92e6,(ulong)uVar1,expected5,&error)
  ;
  std::__cxx11::string::~string((string *)expected5);
  std::__cxx11::string::~string((string *)props5);
  std::__cxx11::string::string<std::allocator<char>>((string *)props5,"a",(allocator<char> *)props3)
  ;
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesBV,(key_type *)props5);
  uVar1 = *pmVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)expected5,"a",(allocator<char> *)expected3);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])(this,(ulong)program,0x92e5,(ulong)uVar1,expected5,&error)
  ;
  std::__cxx11::string::~string((string *)expected5);
  std::__cxx11::string::~string((string *)props5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props5,"vs_color",(allocator<char> *)props3);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesI,(key_type *)props5);
  uVar1 = *pmVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)expected5,"vs_color",(allocator<char> *)expected3);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])(this,(ulong)program,0x92e3,(ulong)uVar1,expected5,&error)
  ;
  std::__cxx11::string::~string((string *)expected5);
  std::__cxx11::string::~string((string *)props5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props5,"fs_color",(allocator<char> *)props3);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesO,(key_type *)props5);
  uVar1 = *pmVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)expected5,"fs_color",(allocator<char> *)expected3);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])(this,(ulong)program,0x92e4,(ulong)uVar1,expected5,&error)
  ;
  std::__cxx11::string::~string((string *)expected5);
  std::__cxx11::string::~string((string *)props5);
  std::__cxx11::string::string<std::allocator<char>>((string *)props5,"x",(allocator<char> *)props3)
  ;
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)props5);
  uVar1 = *pmVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)expected5,"x",(allocator<char> *)expected3);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])(this,(ulong)program,0x92e1,(ulong)uVar1,expected5,&error)
  ;
  std::__cxx11::string::~string((string *)expected5);
  std::__cxx11::string::~string((string *)props5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props5,"x",(allocator<char> *)expected5);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x11])(this,(ulong)program,0x92e1,props5,1,&error);
  std::__cxx11::string::~string((string *)props5);
  props2[4] = 0x930a;
  props2[5] = 0x9309;
  props2[6] = 0x9307;
  props2[7] = 0x9308;
  props2[0] = 0x92f9;
  props2[1] = 0x92fa;
  props2[2] = 0x92fb;
  props2[3] = 0x930b;
  props2[8] = 0x9306;
  props2[9] = 0x92e7;
  expected2[6] = 0;
  expected2[7] = 0;
  expected2[8] = 0;
  expected2[9] = 0;
  expected2[0] = 9;
  expected2[1] = 0x8b52;
  expected2[2] = 1;
  expected2[3] = 0;
  expected2[4] = 1;
  expected2[5] = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props5,"vs_color",(allocator<char> *)expected5);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesI,(key_type *)props5);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e3,(ulong)*pmVar3,10,props2,10,expected2,&error);
  std::__cxx11::string::~string((string *)props5);
  props3[8] = 0x9306;
  props3[9] = 0x92e7;
  props3[10] = 0x930f;
  props3[4] = 0x930a;
  props3[5] = 0x9309;
  props3[6] = 0x9307;
  props3[7] = 0x9308;
  props3[0] = 0x92f9;
  props3[1] = 0x92fa;
  props3[2] = 0x92fb;
  props3[3] = 0x930b;
  expected3[6] = 0;
  expected3[7] = 0;
  expected3[8] = 0;
  expected3[9] = 0;
  expected3[10] = 0;
  expected3[0] = 9;
  expected3[1] = 0x8b52;
  expected3[2] = 1;
  expected3[3] = 0;
  expected3[4] = 1;
  expected3[5] = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props5,"fs_color",(allocator<char> *)expected5);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesO,(key_type *)props5);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e4,(ulong)*pmVar3,0xb,props3,0xb,(allocator<char> *)expected3,
             &error);
  std::__cxx11::string::~string((string *)props5);
  props5[8] = 0x9301;
  props5[9] = 0x930b;
  props5[10] = 0x930a;
  props5[0xb] = 0x9306;
  props5[4] = 0x92fd;
  props5[5] = 0x92fe;
  props5[6] = 0x92ff;
  props5[7] = 0x9300;
  props5[0] = 0x92f9;
  props5[1] = 0x92fa;
  props5[2] = 0x92fb;
  props5[3] = 0x92fc;
  props5[0xc] = 0x930e;
  expected5[8] = -1;
  expected5[9] = 0;
  expected5[10] = 1;
  expected5[0xb] = 0;
  expected5[4] = -1;
  expected5[5] = -1;
  expected5[6] = -1;
  expected5[7] = 0;
  expected5[0] = 2;
  expected5[1] = 0x8b52;
  expected5[2] = 1;
  expected5[3] = -1;
  expected5[0xc] = 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props7,"x",(allocator<char> *)&local_228);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesU,(key_type *)props7);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e1,(ulong)*pmVar3,0xd,props5,0xd,(allocator<char> *)expected5,
             &error);
  std::__cxx11::string::~string((string *)props7);
  props6[4] = 0x930a;
  props6[5] = 0x9306;
  props6[6] = 0x9305;
  props6[0] = 0x92f9;
  props6[1] = 0x9302;
  props6[2] = 0x9304;
  props6[3] = 0x930b;
  local_138 = 0xd;
  uStack_130 = 1;
  local_128 = 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props7,"a",(allocator<char> *)&local_228);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesBV,(key_type *)props7);
  local_120 = *pmVar3;
  std::__cxx11::string::~string((string *)props7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)props7,"SimpleBuffer",(allocator<char> *)&local_228);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesSSB,(key_type *)props7);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e6,(ulong)*pmVar3,7,props6,7,&local_138,&error);
  std::__cxx11::string::~string((string *)props7);
  props7[8] = 0x9306;
  props7[9] = 0x930c;
  props7[10] = 0x930d;
  props7[4] = 0x92fe;
  props7[5] = 0x9300;
  props7[6] = 0x930b;
  props7[7] = 0x930a;
  props7[0] = 0x92f9;
  props7[1] = 0x92fa;
  props7[2] = 0x92fb;
  props7[3] = 0x92fd;
  local_228 = 0x8b5200000002;
  local_220 = 1;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"SimpleBuffer",&local_331)
  ;
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesSSB,&local_248);
  local_21c = *pmVar3;
  local_218 = 0;
  uStack_210 = 0x100000000;
  local_208 = 0x100000000;
  local_200 = 0;
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"a",&local_331);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&indicesBV,&local_248);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e5,(ulong)*pmVar3,0xb,props7,0xb,(allocator<char> *)&local_228,
             &error);
  std::__cxx11::string::~string((string *)&local_248);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.
              super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,program);
  lVar2 = error;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&indicesU._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&indicesO._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&indicesI._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&indicesBV._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&indicesSSB._M_t);
  return lVar2;
}

Assistant:

virtual long Run()
	{
		long error = NO_ERROR;

		const char* srcTCS = "#version 430                                     \n"
							 "out vec4 fs_color;                               \n"
							 ""
							 "layout(location = 1) uniform vec4 x;             \n"
							 ""
							 "layout(binding = 0) buffer SimpleBuffer {        \n"
							 "   vec4 a;                                       \n"
							 "};                                               \n"
							 ""
							 "in vec4 vs_color;                                \n"
							 "void main() {                                    \n"
							 "   fs_color = vs_color + x + a;                  \n"
							 "}";

		const GLuint tcs = CreateShaderProgram(GL_FRAGMENT_SHADER, 1, &srcTCS);

		VerifyGetProgramInterfaceiv(tcs, GL_PROGRAM_INPUT, GL_MAX_NAME_LENGTH, 9, error);
		VerifyGetProgramInterfaceiv(tcs, GL_PROGRAM_INPUT, GL_ACTIVE_RESOURCES, 1, error);
		VerifyGetProgramInterfaceiv(tcs, GL_PROGRAM_OUTPUT, GL_MAX_NAME_LENGTH, 9, error);
		VerifyGetProgramInterfaceiv(tcs, GL_PROGRAM_OUTPUT, GL_ACTIVE_RESOURCES, 1, error);
		VerifyGetProgramInterfaceiv(tcs, GL_UNIFORM, GL_MAX_NAME_LENGTH, 2, error);
		VerifyGetProgramInterfaceiv(tcs, GL_UNIFORM, GL_ACTIVE_RESOURCES, 1, error);
		VerifyGetProgramInterfaceiv(tcs, GL_BUFFER_VARIABLE, GL_MAX_NAME_LENGTH, 2, error);
		VerifyGetProgramInterfaceiv(tcs, GL_BUFFER_VARIABLE, GL_ACTIVE_RESOURCES, 1, error);
		VerifyGetProgramInterfaceiv(tcs, GL_SHADER_STORAGE_BLOCK, GL_ACTIVE_RESOURCES, 1, error);
		VerifyGetProgramInterfaceiv(tcs, GL_SHADER_STORAGE_BLOCK, GL_MAX_NAME_LENGTH, 13, error);
		VerifyGetProgramInterfaceiv(tcs, GL_SHADER_STORAGE_BLOCK, GL_MAX_NUM_ACTIVE_VARIABLES, 1, error);

		std::map<std::string, GLuint> indicesSSB;
		std::map<std::string, GLuint> indicesBV;
		std::map<std::string, GLuint> indicesI;
		std::map<std::string, GLuint> indicesO;
		std::map<std::string, GLuint> indicesU;
		VerifyGetProgramResourceIndex(tcs, GL_PROGRAM_INPUT, indicesI, "vs_color", error);
		VerifyGetProgramResourceIndex(tcs, GL_PROGRAM_OUTPUT, indicesO, "fs_color", error);
		VerifyGetProgramResourceIndex(tcs, GL_UNIFORM, indicesU, "x", error);
		VerifyGetProgramResourceIndex(tcs, GL_SHADER_STORAGE_BLOCK, indicesSSB, "SimpleBuffer", error);
		VerifyGetProgramResourceIndex(tcs, GL_BUFFER_VARIABLE, indicesBV, "a", error);

		VerifyGetProgramResourceName(tcs, GL_SHADER_STORAGE_BLOCK, indicesSSB["SimpleBuffer"], "SimpleBuffer", error);
		VerifyGetProgramResourceName(tcs, GL_BUFFER_VARIABLE, indicesBV["a"], "a", error);
		VerifyGetProgramResourceName(tcs, GL_PROGRAM_INPUT, indicesI["vs_color"], "vs_color", error);
		VerifyGetProgramResourceName(tcs, GL_PROGRAM_OUTPUT, indicesO["fs_color"], "fs_color", error);
		VerifyGetProgramResourceName(tcs, GL_UNIFORM, indicesU["x"], "x", error);

		VerifyGetProgramResourceLocation(tcs, GL_UNIFORM, "x", 1, error);

		GLenum props2[] = { GL_NAME_LENGTH,
							GL_TYPE,
							GL_ARRAY_SIZE,
							GL_REFERENCED_BY_COMPUTE_SHADER,
							GL_REFERENCED_BY_FRAGMENT_SHADER,
							GL_REFERENCED_BY_GEOMETRY_SHADER,
							GL_REFERENCED_BY_TESS_CONTROL_SHADER,
							GL_REFERENCED_BY_TESS_EVALUATION_SHADER,
							GL_REFERENCED_BY_VERTEX_SHADER,
							GL_IS_PER_PATCH };
		GLint expected2[] = { 9, GL_FLOAT_VEC4, 1, 0, 1, 0, 0, 0, 0, 0 };
		VerifyGetProgramResourceiv(tcs, GL_PROGRAM_INPUT, indicesI["vs_color"], 10, props2, 10, expected2, error);

		GLenum props3[] = { GL_NAME_LENGTH,
							GL_TYPE,
							GL_ARRAY_SIZE,
							GL_REFERENCED_BY_COMPUTE_SHADER,
							GL_REFERENCED_BY_FRAGMENT_SHADER,
							GL_REFERENCED_BY_GEOMETRY_SHADER,
							GL_REFERENCED_BY_TESS_CONTROL_SHADER,
							GL_REFERENCED_BY_TESS_EVALUATION_SHADER,
							GL_REFERENCED_BY_VERTEX_SHADER,
							GL_IS_PER_PATCH,
							GL_LOCATION_INDEX };
		GLint expected3[] = { 9, GL_FLOAT_VEC4, 1, 0, 1, 0, 0, 0, 0, 0, 0 };
		VerifyGetProgramResourceiv(tcs, GL_PROGRAM_OUTPUT, indicesO["fs_color"], 11, props3, 11, expected3, error);

		GLenum props5[] = { GL_NAME_LENGTH,
							GL_TYPE,
							GL_ARRAY_SIZE,
							GL_OFFSET,
							GL_BLOCK_INDEX,
							GL_ARRAY_STRIDE,
							GL_MATRIX_STRIDE,
							GL_IS_ROW_MAJOR,
							GL_ATOMIC_COUNTER_BUFFER_INDEX,
							GL_REFERENCED_BY_COMPUTE_SHADER,
							GL_REFERENCED_BY_FRAGMENT_SHADER,
							GL_REFERENCED_BY_VERTEX_SHADER,
							GL_LOCATION };
		GLint expected5[] = { 2, GL_FLOAT_VEC4, 1, -1, -1, -1, -1, 0, -1, 0, 1, 0, 1 };
		VerifyGetProgramResourceiv(tcs, GL_UNIFORM, indicesU["x"], 13, props5, 13, expected5, error);

		GLenum props6[] = { GL_NAME_LENGTH,
							GL_BUFFER_BINDING,
							GL_NUM_ACTIVE_VARIABLES,
							GL_REFERENCED_BY_COMPUTE_SHADER,
							GL_REFERENCED_BY_FRAGMENT_SHADER,
							GL_REFERENCED_BY_VERTEX_SHADER,
							GL_ACTIVE_VARIABLES };
		GLint expected6[] = { 13, 0, 1, 0, 1, 0, static_cast<GLint>(indicesBV["a"]) };
		VerifyGetProgramResourceiv(tcs, GL_SHADER_STORAGE_BLOCK, indicesSSB["SimpleBuffer"], 7, props6, 7, expected6,
								   error);

		GLenum props7[] = { GL_NAME_LENGTH,
							GL_TYPE,
							GL_ARRAY_SIZE,
							GL_BLOCK_INDEX,
							GL_ARRAY_STRIDE,
							GL_IS_ROW_MAJOR,
							GL_REFERENCED_BY_COMPUTE_SHADER,
							GL_REFERENCED_BY_FRAGMENT_SHADER,
							GL_REFERENCED_BY_VERTEX_SHADER,
							GL_TOP_LEVEL_ARRAY_SIZE,
							GL_TOP_LEVEL_ARRAY_STRIDE };
		GLint expected7[] = {
			2, GL_FLOAT_VEC4, 1, static_cast<GLint>(indicesSSB["SimpleBuffer"]), 0, 0, 0, 1, 0, 1, 0
		};
		VerifyGetProgramResourceiv(tcs, GL_BUFFER_VARIABLE, indicesBV["a"], 11, props7, 11, expected7, error);

		glDeleteProgram(tcs);
		return error;
	}